

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

uint32 __thiscall rw::TexDictionary::streamGetSize(TexDictionary *this)

{
  LLLink *pLVar1;
  uint32 uVar2;
  int iVar3;
  int iVar4;
  LLLink *pLVar5;
  
  iVar4 = 0x10;
  pLVar5 = (this->textures).link.next;
  while (pLVar5 != &(this->textures).link) {
    pLVar1 = pLVar5->next;
    uVar2 = Texture::streamGetSizeNative((Texture *)(pLVar5 + -1));
    iVar3 = PluginList::streamGetSize((PluginList *)&Texture::s_plglist,(Texture *)(pLVar5 + -1));
    iVar4 = iVar4 + uVar2 + iVar3 + 0x18;
    pLVar5 = pLVar1;
  }
  iVar3 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  return iVar3 + iVar4 + 0xc;
}

Assistant:

uint32
TexDictionary::streamGetSize(void)
{
	uint32 size = 12 + 4;
	FORLIST(lnk, this->textures){
		Texture *tex = Texture::fromDict(lnk);
		size += 12 + tex->streamGetSizeNative();
		size += 12 + Texture::s_plglist.streamGetSize(tex);
	}
	size += 12 + s_plglist.streamGetSize(this);
	return size;
}